

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcRailingType::IfcRailingType(IfcRailingType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcRailingType";
  IfcBuildingElementType::IfcBuildingElementType
            ((IfcBuildingElementType *)this,&PTR_construction_vtable_24__007b0ef8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x7b0dc8;
  *(undefined8 *)&this->field_0x1c0 = 0x7b0ee0;
  *(undefined8 *)&this->field_0x88 = 0x7b0df0;
  *(undefined8 *)&this->field_0x98 = 0x7b0e18;
  *(undefined8 *)&this->field_0xf0 = 0x7b0e40;
  *(undefined8 *)&this->field_0x148 = 0x7b0e68;
  *(undefined8 *)&this->field_0x180 = 0x7b0e90;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x7b0eb8;
  *(undefined1 **)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x10 =
       &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x20;
  *(undefined8 *)
   &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x18 = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRailingType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcRailingType() : Object("IfcRailingType") {}